

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall SoftHSM::C_FindObjectsFinal(SoftHSM *this,CK_SESSION_HANDLE hSession)

{
  int iVar1;
  CK_RV CVar2;
  Session *this_00;
  
  CVar2 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar2 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      CVar2 = 0x91;
      if (iVar1 == 1) {
        Session::resetOp(this_00);
        CVar2 = 0;
      }
    }
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::C_FindObjectsFinal(CK_SESSION_HANDLE hSession)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_FIND) return CKR_OPERATION_NOT_INITIALIZED;

	session->resetOp();
	return CKR_OK;
}